

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

Matrix4d *
opengv::relative_pose::modules::ge::composeGwithJacobians
          (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
          Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
          Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
          Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
          Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
          Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,Matrix4d *G_jac1,Matrix4d *G_jac2,
          Matrix4d *G_jac3)

{
  double dVar1;
  Scalar SVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Matrix4d *in_RDI;
  Scalar SVar6;
  Scalar SVar7;
  Scalar SVar8;
  Scalar SVar9;
  Scalar SVar10;
  Scalar SVar11;
  Scalar SVar12;
  Scalar SVar13;
  Scalar SVar14;
  Scalar SVar15;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac3;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac2;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac1;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac3;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac2;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac1;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  double temp;
  rotation_t R_jac3;
  rotation_t R_jac2;
  rotation_t R_jac1;
  rotation_t R;
  Matrix4d *G;
  DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *in_stack_fffffffffffedce8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffedcf0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *this;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other_00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *this_00;
  dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
  *this_01;
  StorageBaseType *matrix;
  double *scalar;
  cayley_t *in_stack_fffffffffffeddc8;
  
  math::cayley2rot_reduced(in_stack_fffffffffffeddc8);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x125e47c);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x125e489);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x125e496);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffedcf0,(Index)in_stack_fffffffffffedce8);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e4cd);
  *pSVar4 = (Scalar)this;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e511);
  *pSVar4 = (Scalar)other;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  other_00 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e555);
  *pSVar4 = (Scalar)other_00;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  this_00 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
             *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e599);
  *pSVar4 = (Scalar)this_00;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e5db);
  *pSVar4 = dVar1 * -2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e5fc);
  *pSVar4 = -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e642);
  *pSVar4 = dVar1 * 2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e663);
  *pSVar4 = 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  this_01 = (dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
             *)(*pdVar3 * -2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e6a7);
  *pSVar4 = (Scalar)this_01;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e6e9);
  *pSVar4 = dVar1 * -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  matrix = (StorageBaseType *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e72c);
  *pSVar4 = (Scalar)matrix;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e74c);
  *pSVar4 = 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  scalar = (double *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e791);
  *pSVar4 = (Scalar)scalar;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e7d4);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e819);
  *pSVar4 = dVar1 * 2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e839);
  *pSVar4 = -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e880);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e8c3);
  *pSVar4 = dVar1 * -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e905);
  *pSVar4 = dVar1 * -2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e925);
  *pSVar4 = -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e96d);
  *pSVar4 = dVar1 * 2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e990);
  *pSVar4 = 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125e9d8);
  *pSVar4 = dVar1 * -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125ea23);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125ea6c);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125eab7);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      (Index)in_stack_fffffffffffedce8);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_stack_fffffffffffedce8,0x125eb00);
  *pSVar4 = dVar1 * 2.0;
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0x125eb1a);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125ebd9);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125ecd3);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125eda3);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125eea1);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125ef9b);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f099);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f197);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f295);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f38f);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f48d);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f58b);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f689);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f783);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f881);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125f97f);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125fa50);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125fb4c);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125fc4b);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125fd1d);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125fdee);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125febb);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x125ffbb);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12600a1);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260187);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260259);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126032b);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12603fc);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12604c9);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12605c9);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12606af);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260795);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260867);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260939);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260a0a);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260ad7);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260bd7);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260cbd);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260da3);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260e75);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1260f47);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261019);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261114);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261214);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12612e5);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12613b7);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261485);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126156b);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261651);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261751);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261822);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12618f3);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12619c5);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261a93);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261b79);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261c5f);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261d5f);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261e30);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261f01);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1261fd3);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12620a1);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262187);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126226d);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126236d);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126243e);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126250f);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12625de);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12626d8);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12627a9);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12628a6);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12629a0);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262a9e);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262b9d);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262c9a);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262d94);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262e92);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1262f91);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126308e);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263188);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263286);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263385);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263457);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263552);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263653);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263725);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12637f7);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12638c5);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12639c4);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263aac);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263b94);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263c66);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263d38);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263e0a);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263ed8);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1263fd7);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12640bf);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12641a7);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264279);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126434b);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126441d);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12644eb);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12645ea);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12646d2);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12647ba);
  *pSVar5 = SVar8 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126488c);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126495e);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264a2f);
  *pSVar5 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264b29);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double(this_01);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264bf8);
  *pSVar5 = SVar6 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264cf7);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264df1);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264eef);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1264fec);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12650eb);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12651e5);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12652e3);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12653e0);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12654df);
  *pSVar5 = SVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12655d9);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12656d7);
  *pSVar5 = SVar7 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12657d4);
  *pSVar5 = SVar7 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12657fb);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126581e);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265841);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265864);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265888);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12658ac);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12658cf);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12658f2);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265915);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265938);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126595c);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265980);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12659a3);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12659c6);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12659e9);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265a0c);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265a30);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265a54);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265a77);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265a9a);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265abd);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265ae0);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265b04);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1265b28);
  *pSVar5 = SVar2;
  Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0x1265b42);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix((Matrix<double,_9,_1,_0,_9,_1> *)0x1265c33);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0x1265d24);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0x1265e15);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0x1265f06);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix((Matrix<double,_9,_1,_0,_9,_1> *)0x1265ff7);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix((Matrix<double,_9,_1,_0,_9,_1> *)0x12660e8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix((Matrix<double,_9,_1,_0,_9,_1> *)0x12661d9);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(other_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00,(Index)other,(Index)this);
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)this,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffedce8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126634f);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266403);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12664d4);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12665ba);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126665d);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12666fc);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12667b4);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126686c);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126693d);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266a0e);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266af4);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266bda);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266c7d);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266d1c);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266dd4);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266e8c);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1266f5d);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126702e);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267114);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12671fa);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126729d);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126733c);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12673f4);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12674ac);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126757d);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126764e);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267734);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126781a);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12678bd);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267971);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267a43);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267b2a);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267bcd);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267c6c);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267d24);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267ddc);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267eae);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1267f80);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268067);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126814e);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12681f1);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268290);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268348);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268400);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12684d2);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12685a4);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126868b);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268772);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268815);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12688b4);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126896c);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268a24);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268af6);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268bc8);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268caf);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268d96);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268e3a);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268eef);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1268fc0);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12690a6);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126914a);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12691ea);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12692a3);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126935c);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126942d);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12694fe);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12695e4);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12696ca);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126976e);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126980e);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x12698c7);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269980);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269a51);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269b22);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269c08);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269cee);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269d92);
  *pSVar5 = SVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269e32);
  *pSVar5 = SVar9 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269eeb);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             other_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)other_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other);
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x1269fa4);
  *pSVar5 = SVar10 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a075);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a146);
  *pSVar5 = SVar11 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a22c);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(other_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,9,0,3,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a312);
  *pSVar5 = SVar12 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffedce8);
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a3dd);
  *pSVar5 = SVar13;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a4a4);
  *pSVar5 = SVar14 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a55a);
  *pSVar5 = SVar15 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffedce8);
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a625);
  *pSVar5 = SVar13;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a6ec);
  *pSVar5 = SVar14 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a7a2);
  *pSVar5 = SVar15 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a858);
  *pSVar5 = SVar15 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffedce8);
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a923);
  *pSVar5 = SVar13;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126a9ea);
  *pSVar5 = SVar14 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126aaa0);
  *pSVar5 = SVar15 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ab56);
  *pSVar5 = SVar15 + *pSVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_fffffffffffedce8);
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ac21);
  *pSVar5 = SVar13;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose(in_stack_fffffffffffedce8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)other_00);
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ace8);
  *pSVar5 = SVar14 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ad9e);
  *pSVar5 = SVar15 + *pSVar5;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)this_00,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other_00);
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                       *)other_00);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ae54);
  *pSVar5 = SVar15 + *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ae7b);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126ae9e);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126aec2);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126aee6);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126af0a);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126af2e);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126af51);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126af74);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126af98);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126afbc);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126afe0);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b004);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b027);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b04a);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b06e);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b092);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b0b6);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b0da);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b0fd);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b120);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b144);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b168);
  *pSVar5 = SVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b18c);
  SVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)this,
                      (Index)in_stack_fffffffffffedce8,0x126b1b0);
  *pSVar5 = SVar2;
  return in_RDI;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeGwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Matrix4d & G_jac1,
    Eigen::Matrix4d & G_jac2,
    Eigen::Matrix4d & G_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) =  2.0*cayley[0];
  R_jac1(0,1) =  2.0*cayley[1];
  R_jac1(0,2) =  2.0*cayley[2];
  R_jac1(1,0) =  2.0*cayley[1];
  R_jac1(1,1) = -2.0*cayley[0];
  R_jac1(1,2) = -2.0;
  R_jac1(2,0) =  2.0*cayley[2];
  R_jac1(2,1) =  2.0;
  R_jac1(2,2) = -2.0*cayley[0];
  R_jac2(0,0) = -2.0*cayley[1];
  R_jac2(0,1) =  2.0*cayley[0];
  R_jac2(0,2) =  2.0;
  R_jac2(1,0) =  2.0*cayley[0];
  R_jac2(1,1) =  2.0*cayley[1];
  R_jac2(1,2) =  2.0*cayley[2];
  R_jac2(2,0) = -2.0;
  R_jac2(2,1) =  2.0*cayley[2];
  R_jac2(2,2) = -2.0*cayley[1];
  R_jac3(0,0) = -2.0*cayley[2];
  R_jac3(0,1) = -2.0;
  R_jac3(0,2) =  2.0*cayley[0];
  R_jac3(1,0) =  2.0;
  R_jac3(1,1) = -2.0*cayley[2];
  R_jac3(1,2) =  2.0*cayley[1];
  R_jac3(2,0) =  2.0*cayley[0];
  R_jac3(2,1) =  2.0*cayley[1];
  R_jac3(2,2) =  2.0*cayley[2];

  //Fill the matrix G using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix4d G;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  G_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  G_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  G_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  G_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  G(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  G(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  G_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  G_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  G_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  G_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  G(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  G(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  G_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  G_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  G_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  G_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  G_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  G_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  G_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  G(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  G(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  G_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  G_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  G_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  G_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  G(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  G(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  G_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  G_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  G_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  G_jac3(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);
  G_jac1(1,0) = G_jac1(0,1);
  G_jac1(2,0) = G_jac1(0,2);
  G_jac1(2,1) = G_jac1(1,2);
  G_jac2(1,0) = G_jac2(0,1);
  G_jac2(2,0) = G_jac2(0,2);
  G_jac2(2,1) = G_jac2(1,2);
  G_jac3(1,0) = G_jac3(0,1);
  G_jac3(2,0) = G_jac3(0,2);
  G_jac3(2,1) = G_jac3(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Matrix<double,1,9> Rows_jac1;
  Rows_jac1.block<1,3>(0,0) = R_jac1.row(0);
  Rows_jac1.block<1,3>(0,3) = R_jac1.row(1);
  Rows_jac1.block<1,3>(0,6) = R_jac1.row(2);
  Eigen::Matrix<double,1,9> Rows_jac2;
  Rows_jac2.block<1,3>(0,0) = R_jac2.row(0);
  Rows_jac2.block<1,3>(0,3) = R_jac2.row(1);
  Rows_jac2.block<1,3>(0,6) = R_jac2.row(2);
  Eigen::Matrix<double,1,9> Rows_jac3;
  Rows_jac3.block<1,3>(0,0) = R_jac3.row(0);
  Rows_jac3.block<1,3>(0,3) = R_jac3.row(1);
  Rows_jac3.block<1,3>(0,6) = R_jac3.row(2);
  
  Eigen::Matrix<double,9,1> Cols_jac1;
  Cols_jac1.block<3,1>(0,0) = R_jac1.col(0);
  Cols_jac1.block<3,1>(3,0) = R_jac1.col(1);
  Cols_jac1.block<3,1>(6,0) = R_jac1.col(2);
  Eigen::Matrix<double,9,1> Cols_jac2;
  Cols_jac2.block<3,1>(0,0) = R_jac2.col(0);
  Cols_jac2.block<3,1>(3,0) = R_jac2.col(1);
  Cols_jac2.block<3,1>(6,0) = R_jac2.col(2);
  Eigen::Matrix<double,9,1> Cols_jac3;
  Cols_jac3.block<3,1>(0,0) = R_jac3.col(0);
  Cols_jac3.block<3,1>(3,0) = R_jac3.col(1);
  Cols_jac3.block<3,1>(6,0) = R_jac3.col(2);
  
  temp =      R.row(2)*y1P*Cols;
  G(0,3)  = temp;
  temp =      R.row(2)*y2P*Rows.transpose();
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows.transpose();
  G(0,3) += temp;
  temp =      R_jac1.row(2)*y1P*Cols;
  G_jac1(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp =      R_jac1.row(2)*y2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z1P*Cols;
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp =      R_jac2.row(2)*y1P*Cols;
  G_jac2(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp =      R_jac2.row(2)*y2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z1P*Cols;
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp =      R_jac3.row(2)*y1P*Cols;
  G_jac3(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp =      R_jac3.row(2)*y2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z1P*Cols;
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  
  temp =      R.row(0)*z1P*Cols;
  G(1,3)  = temp;
  temp =      R.row(0)*z2P*Rows.transpose();
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows.transpose();
  G(1,3) += temp;
  temp =      R_jac1.row(0)*z1P*Cols;
  G_jac1(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp =      R_jac1.row(0)*z2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x1P*Cols;
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp =      R_jac2.row(0)*z1P*Cols;
  G_jac2(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp =      R_jac2.row(0)*z2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x1P*Cols;
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp =      R_jac3.row(0)*z1P*Cols;
  G_jac3(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp =      R_jac3.row(0)*z2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x1P*Cols;
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  
  temp =      R.row(1)*x1P*Cols;
  G(2,3)  = temp;
  temp =      R.row(1)*x2P*Rows.transpose();
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows.transpose();
  G(2,3) += temp;
  temp =      R_jac1.row(1)*x1P*Cols;
  G_jac1(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp =      R_jac1.row(1)*x2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y1P*Cols;
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp =      R_jac2.row(1)*x1P*Cols;
  G_jac2(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp =      R_jac2.row(1)*x2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y1P*Cols;
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp =      R_jac3.row(1)*x1P*Cols;
  G_jac3(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp =      R_jac3.row(1)*x2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y1P*Cols;
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rows.transpose();
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac1;
  G_jac1(3,3)  = temp;
  temp = -2.0*Rows_jac1*m22P*Rows.transpose();
  G_jac1(3,3) += temp;
  temp = -2.0*Rows_jac1*m12P*Cols;
  G_jac1(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac1;
  G_jac1(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac2;
  G_jac2(3,3)  = temp;
  temp = -2.0*Rows_jac2*m22P*Rows.transpose();
  G_jac2(3,3) += temp;
  temp = -2.0*Rows_jac2*m12P*Cols;
  G_jac2(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac2;
  G_jac2(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac3;
  G_jac3(3,3)  = temp;
  temp = -2.0*Rows_jac3*m22P*Rows.transpose();
  G_jac3(3,3) += temp;
  temp = -2.0*Rows_jac3*m12P*Cols;
  G_jac3(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac3;
  G_jac3(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);
  G_jac1(3,0) = G_jac1(0,3);
  G_jac1(3,1) = G_jac1(1,3);
  G_jac1(3,2) = G_jac1(2,3);
  G_jac2(3,0) = G_jac2(0,3);
  G_jac2(3,1) = G_jac2(1,3);
  G_jac2(3,2) = G_jac2(2,3);
  G_jac3(3,0) = G_jac3(0,3);
  G_jac3(3,1) = G_jac3(1,3);
  G_jac3(3,2) = G_jac3(2,3);

  return G;
}